

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

uint rlLoadShaderCode(char *vsCode,char *fsCode)

{
  uint vShaderId;
  uint fShaderId;
  uint uVar1;
  int i;
  GLuint GVar2;
  GLenum type;
  int num;
  int namelen;
  int uniformCount;
  char name [256];
  
  fShaderId = RLGL.State.defaultFShaderId;
  vShaderId = RLGL.State.defaultVShaderId;
  if (vsCode != (char *)0x0) {
    vShaderId = rlCompileShader(vsCode,0x8b31);
  }
  if (fsCode != (char *)0x0) {
    fShaderId = rlCompileShader(fsCode,0x8b30);
  }
  if ((vShaderId != RLGL.State.defaultVShaderId) ||
     (uVar1 = RLGL.State.defaultShader.id, fShaderId != RLGL.State.defaultFShaderId)) {
    uVar1 = rlLoadShaderProgram(vShaderId,fShaderId);
    if (vShaderId != RLGL.State.defaultVShaderId) {
      (*glad_glDetachShader)(uVar1,vShaderId);
      (*glad_glDeleteShader)(vShaderId);
    }
    if (fShaderId != RLGL.State.defaultFShaderId) {
      (*glad_glDetachShader)(uVar1,fShaderId);
      (*glad_glDeleteShader)(fShaderId);
    }
    if (uVar1 == 0) {
      TraceLog(4,"SHADER: Failed to load custom shader code");
      uVar1 = RLGL.State.defaultShader.id;
    }
  }
  uniformCount = -1;
  (*glad_glGetProgramiv)(uVar1,0x8b86,&uniformCount);
  for (GVar2 = 0; (int)GVar2 < uniformCount; GVar2 = GVar2 + 1) {
    namelen = -1;
    num = -1;
    type = 0;
    (*glad_glGetActiveUniform)(uVar1,GVar2,0xff,&namelen,&num,&type,name);
  }
  return uVar1;
}

Assistant:

unsigned int rlLoadShaderCode(const char *vsCode, const char *fsCode)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    unsigned int vertexShaderId = RLGL.State.defaultVShaderId;
    unsigned int fragmentShaderId = RLGL.State.defaultFShaderId;

    if (vsCode != NULL) vertexShaderId = rlCompileShader(vsCode, GL_VERTEX_SHADER);
    if (fsCode != NULL) fragmentShaderId = rlCompileShader(fsCode, GL_FRAGMENT_SHADER);

    if ((vertexShaderId == RLGL.State.defaultVShaderId) && (fragmentShaderId == RLGL.State.defaultFShaderId)) id = RLGL.State.defaultShader.id;
    else
    {
        id = rlLoadShaderProgram(vertexShaderId, fragmentShaderId);

        if (vertexShaderId != RLGL.State.defaultVShaderId)
        {
            // Detach shader before deletion to make sure memory is freed
            glDetachShader(id, vertexShaderId);
            glDeleteShader(vertexShaderId);
        }
        if (fragmentShaderId != RLGL.State.defaultFShaderId)
        {
            // Detach shader before deletion to make sure memory is freed
            glDetachShader(id, fragmentShaderId);
            glDeleteShader(fragmentShaderId);
        }

        if (id == 0)
        {
            TRACELOG(LOG_WARNING, "SHADER: Failed to load custom shader code");
            id = RLGL.State.defaultShader.id;
        }
    }

    // Get available shader uniforms
    // NOTE: This information is useful for debug...
    int uniformCount = -1;

    glGetProgramiv(id, GL_ACTIVE_UNIFORMS, &uniformCount);

    for (int i = 0; i < uniformCount; i++)
    {
        int namelen = -1;
        int num = -1;
        char name[256]; // Assume no variable names longer than 256
        GLenum type = GL_ZERO;

        // Get the name of the uniforms
        glGetActiveUniform(id, i, sizeof(name) - 1, &namelen, &num, &type, name);

        name[namelen] = 0;

        TRACELOGD("SHADER: [ID %i] Active uniform (%s) set at location: %i", id, name, glGetUniformLocation(id, name));
    }
#endif

    return id;
}